

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sle_8_pd7(void)

{
  uint value;
  
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] - 2;
  value = 0;
  if (m68ki_cpu.not_z_flag == 0) {
    value = 0xff;
  }
  if ((char)((byte)m68ki_cpu.v_flag ^ (byte)m68ki_cpu.n_flag) < '\0') {
    value = 0xff;
  }
  m68ki_write_8_fc(m68ki_cpu.dar[0xf],m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_sle_8_pd7(void)
{
	m68ki_write_8(EA_A7_PD_8(), COND_LE() ? 0xff : 0);
}